

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::Stop(Benchmark *this,Slice *name)

{
  FILE *pFVar1;
  byte bVar2;
  int iVar3;
  Env *pEVar4;
  undefined4 extraout_var;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  undefined8 uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 local_130 [32];
  Slice local_110 [2];
  allocator local_e9;
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  char local_88 [8];
  char rate [100];
  double finish;
  Slice *name_local;
  Benchmark *this_local;
  
  pEVar4 = Env::Default();
  iVar3 = (*pEVar4->_vptr_Env[0x15])();
  auVar10._4_4_ = extraout_var;
  auVar10._0_4_ = iVar3;
  auVar10._8_4_ = extraout_var;
  auVar10._12_4_ = 0x45300000;
  register0x00001200 =
       ((auVar10._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 1e-06;
  if (this->done_ < 1) {
    this->done_ = 1;
  }
  if (0 < this->bytes_) {
    snprintf(local_88,100,"%6.1f MB/s",
             ((double)this->bytes_ / 1048576.0) / (register0x00001200 - this->start_));
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,local_88,&local_e9);
      std::operator+(local_c8,(char *)local_e8);
      std::operator+(local_a8,local_c8);
      std::__cxx11::string::operator=((string *)&this->message_,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    else {
      std::__cxx11::string::operator=((string *)&this->message_,local_88);
    }
  }
  pFVar1 = _stdout;
  Slice::ToString_abi_cxx11_((Slice *)(local_130 + 0x20));
  uVar6 = std::__cxx11::string::c_str();
  dVar9 = stack0xffffffffffffffe0 - this->start_;
  iVar3 = this->done_;
  bVar2 = std::__cxx11::string::empty();
  pcVar7 = " ";
  if ((bVar2 & 1) != 0) {
    pcVar7 = "";
  }
  uVar8 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"%-12s : %11.3f micros/op;%s%s\n",(dVar9 * 1000000.0) / (double)iVar3,uVar6,pcVar7,
          uVar8);
  std::__cxx11::string::~string((string *)(local_130 + 0x20));
  pFVar1 = _stdout;
  if ((FLAGS_histogram & 1U) != 0) {
    Histogram::ToString_abi_cxx11_((Histogram *)local_130);
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"Microseconds per op:\n%s\n",uVar6);
    std::__cxx11::string::~string((string *)local_130);
  }
  fflush(_stdout);
  return;
}

Assistant:

void Stop(const Slice& name) {
    double finish = Env::Default()->NowMicros() * 1e-6;

    // Pretend at least one op was done in case we are running a benchmark
    // that does not call FinishedSingleOp().
    if (done_ < 1) done_ = 1;

    if (bytes_ > 0) {
      char rate[100];
      std::snprintf(rate, sizeof(rate), "%6.1f MB/s",
                    (bytes_ / 1048576.0) / (finish - start_));
      if (!message_.empty()) {
        message_ = std::string(rate) + " " + message_;
      } else {
        message_ = rate;
      }
    }

    std::fprintf(stdout, "%-12s : %11.3f micros/op;%s%s\n",
                 name.ToString().c_str(), (finish - start_) * 1e6 / done_,
                 (message_.empty() ? "" : " "), message_.c_str());
    if (FLAGS_histogram) {
      std::fprintf(stdout, "Microseconds per op:\n%s\n",
                   hist_.ToString().c_str());
    }
    std::fflush(stdout);
  }